

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O3

BasePropHandleT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
 __thiscall
OpenMesh::PropertyContainer::
add<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
          (PropertyContainer *this,
          FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>
          *param_1,string *_name)

{
  pointer *pppBVar1;
  iterator __position;
  pointer pcVar2;
  BaseProperty **ppBVar3;
  BaseProperty *pBVar4;
  BaseHandle BVar5;
  BaseProperty *local_30;
  
  ppBVar3 = (this->properties_).
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->properties_).
       super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  BVar5.idx_ = 0;
  if (ppBVar3 == __position._M_current) {
LAB_0016bf70:
    if (ppBVar3 != __position._M_current) goto LAB_0016bf9d;
  }
  else {
    do {
      if (*ppBVar3 == (BaseProperty *)0x0) goto LAB_0016bf70;
      ppBVar3 = ppBVar3 + 1;
      BVar5.idx_ = BVar5.idx_ + 1;
    } while (ppBVar3 != __position._M_current);
  }
  local_30 = (BaseProperty *)0x0;
  if (__position._M_current ==
      (this->properties_).
      super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<OpenMesh::BaseProperty*,std::allocator<OpenMesh::BaseProperty*>>::
    _M_realloc_insert<OpenMesh::BaseProperty*>
              ((vector<OpenMesh::BaseProperty*,std::allocator<OpenMesh::BaseProperty*>> *)
               &this->properties_,__position,&local_30);
  }
  else {
    *__position._M_current = (BaseProperty *)0x0;
    pppBVar1 = &(this->properties_).
                super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
LAB_0016bf9d:
  pBVar4 = (BaseProperty *)operator_new(0x48);
  pBVar4->_vptr_BaseProperty = (_func_int **)&PTR__BaseProperty_001c2cc0;
  (pBVar4->name_)._M_dataplus._M_p = (pointer)&(pBVar4->name_).field_2;
  pcVar2 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pBVar4->name_,pcVar2,pcVar2 + _name->_M_string_length);
  pBVar4->persistent_ = false;
  pBVar4->_vptr_BaseProperty = (_func_int **)&PTR__PropertyT_001c1a38;
  pBVar4[1]._vptr_BaseProperty = (_func_int **)0x0;
  pBVar4[1].name_._M_dataplus._M_p = (pointer)0x0;
  pBVar4[1].name_._M_string_length = 0;
  (this->properties_).
  super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>._M_impl.
  super__Vector_impl_data._M_start[(uint)BVar5.idx_] = pBVar4;
  return (BaseHandle)(BaseHandle)BVar5.idx_;
}

Assistant:

BasePropHandleT<T> add(const T&, const std::string& _name="<unknown>")
  {
    Properties::iterator p_it=properties_.begin(), p_end=properties_.end();
    int idx=0;
    for ( ; p_it!=p_end && *p_it!=NULL; ++p_it, ++idx ) {};
    if (p_it==p_end) properties_.push_back(NULL);
    properties_[idx] = new PropertyT<T>(_name);
    return BasePropHandleT<T>(idx);
  }